

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcPartialsPartialsAutoScaling
          (BeagleCPUImpl<double,_1,_0> *this,double *destP,double *partials1,double *matrices1,
          double *partials2,double *matrices2,int *activateScaling)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  double __x;
  double *pdVar4;
  double *pdVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int expTmp;
  int local_74;
  double *local_70;
  double *local_68;
  ulong local_60;
  double *local_58;
  double *local_50;
  double *local_48;
  ulong local_40;
  ulong local_38;
  
  local_70 = partials1;
  local_68 = partials2;
  local_58 = destP;
  local_50 = matrices1;
  local_48 = matrices2;
  for (local_60 = 0; (int)local_60 < this->kCategoryCount; local_60 = (ulong)((int)local_60 + 1)) {
    iVar10 = this->kPatternCount;
    uVar8 = (ulong)(uint)(this->kPartialsPaddedStateCount * (int)local_60 * iVar10);
    local_38 = uVar8;
    for (iVar7 = 0; pdVar5 = local_68, pdVar4 = local_70, iVar7 < iVar10; iVar7 = iVar7 + 1) {
      iVar9 = (int)uVar8;
      local_38 = (ulong)(int)local_38;
      iVar10 = 0;
      uVar11 = this->kMatrixSize * (int)local_60;
      while( true ) {
        local_40 = (ulong)uVar11;
        uVar3 = this->kStateCount;
        if ((int)uVar3 <= iVar10) break;
        auVar12 = ZEXT816(0) << 0x40;
        auVar13 = ZEXT816(0) << 0x40;
        for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
          auVar14._8_8_ = 0;
          auVar14._0_8_ = matrices1[(long)(int)uVar11 + uVar8];
          auVar15._8_8_ = 0;
          auVar15._0_8_ = matrices2[(long)(int)uVar11 + uVar8];
          auVar1._8_8_ = 0;
          auVar1._0_8_ = pdVar4[(long)iVar9 + uVar8];
          auVar12 = vfmadd231sd_fma(auVar12,auVar14,auVar1);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = pdVar5[(long)iVar9 + uVar8];
          auVar13 = vfmadd231sd_fma(auVar13,auVar15,auVar2);
        }
        __x = auVar12._0_8_ * auVar13._0_8_;
        destP[local_38] = __x;
        if (*activateScaling == 0) {
          frexp(__x,&local_74);
          iVar6 = -local_74;
          if (0 < local_74) {
            iVar6 = local_74;
          }
          if (this->scalingExponentThreshold < iVar6) {
            *activateScaling = 1;
          }
          uVar11 = (uint)local_40;
          destP = local_58;
          matrices1 = local_50;
          matrices2 = local_48;
        }
        uVar11 = uVar11 + 1 + uVar3;
        local_38 = local_38 + 1;
        iVar10 = iVar10 + 1;
      }
      iVar10 = this->kPatternCount;
      uVar8 = (ulong)(uint)(iVar9 + this->kPartialsPaddedStateCount);
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcPartialsPartialsAutoScaling(REALTYPE* destP,
                                                               const REALTYPE* partials1,
                                                               const REALTYPE* matrices1,
                                                               const REALTYPE* partials2,
                                                               const REALTYPE* matrices2,
                                                               int* activateScaling) {

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int u = l*kPartialsPaddedStateCount*kPatternCount;
        int v = l*kPartialsPaddedStateCount*kPatternCount;
        for (int k = 0; k < kPatternCount; k++) {
            int w = l * kMatrixSize;
            for (int i = 0; i < kStateCount; i++) {
                REALTYPE sum1 = 0.0, sum2 = 0.0;
                for (int j = 0; j < kStateCount; j++) {
                    sum1 += matrices1[w] * partials1[v + j];
                    sum2 += matrices2[w] * partials2[v + j];
                    w++;
                }

                // increment for the extra column at the end
                w += T_PAD;

                destP[u] = sum1 * sum2;

                if (*activateScaling == 0) {
                    int expTmp;
                    frexp(destP[u], &expTmp);
                    if (abs(expTmp) > scalingExponentThreshold)
                        *activateScaling = 1;
                }

                u++;
            }
            u += P_PAD;
            v += kPartialsPaddedStateCount;
        }
    }
}